

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.h
# Opt level: O3

bool __thiscall
slang::IntervalMap<unsigned_long,std::monostate,0u>::iterator::
overflow<slang::IntervalMapDetails::BranchNode<unsigned_long,8u,false>>
          (iterator *this,uint32_t level,allocator_type *alloc)

{
  iterator *piVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  uintptr_t intWord;
  NodeRef NVar5;
  BranchNode<unsigned_long,_8U,_false> *pBVar6;
  undefined7 extraout_var;
  uint uVar7;
  uint uVar8;
  long lVar9;
  int iVar10;
  undefined4 in_register_00000034;
  ulong uVar11;
  uint uVar12;
  uint32_t uVar13;
  uint32_t uVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  uint32_t curSizes [4];
  uint32_t newSizes [4];
  BranchNode<unsigned_long,_8U,_false> *nodes [4];
  interval<unsigned_long> ival;
  uint local_d8 [6];
  PointerIntPair<void_*,_6U,_6U,_unsigned_int> local_c0;
  iterator *local_b8;
  IndexPair local_b0;
  ulong local_a8;
  uint local_9c;
  uint32_t local_98 [6];
  ulong local_80;
  allocator_type *local_78;
  iterator *local_70;
  ulong local_68 [4];
  ulong local_48;
  interval<unsigned_long> local_40;
  
  local_80 = CONCAT44(in_register_00000034,level);
  piVar1 = this + 8;
  lVar17 = (ulong)level * 0x10;
  uVar13 = *(uint32_t *)(*(long *)(this + 8) + 0xc + lVar17);
  local_78 = alloc;
  local_70 = this;
  local_c0.value = (uintptr_t)IntervalMapDetails::Path::getLeftSibling((Path *)piVar1,level);
  if (local_c0.value == 0) {
    uVar8 = 0;
  }
  else {
    uVar7 = (uint)local_c0.value & 0x3f;
    uVar8 = uVar7 + 1;
    uVar13 = uVar13 + uVar7 + 1;
    local_68[0] = local_c0.value & 0xffffffffffffffc0;
    local_d8[0] = uVar8;
  }
  bVar3 = local_c0.value != 0;
  lVar9 = *(long *)piVar1;
  uVar7 = *(uint *)(lVar9 + 8 + lVar17);
  local_d8[bVar3] = uVar7;
  uVar14 = uVar8 + uVar7;
  uVar7 = bVar3 + 1;
  local_68[bVar3] = *(ulong *)(lVar9 + lVar17);
  NVar5 = IntervalMapDetails::Path::getRightSibling((Path *)piVar1,(uint32_t)local_80);
  uVar8 = uVar7;
  if (NVar5.pip.value != 0) {
    uVar8 = (uint)NVar5.pip.value & 0x3f;
    local_d8[uVar7] = uVar8 + 1;
    uVar14 = uVar14 + uVar8 + 1;
    uVar8 = bVar3 | 2;
    local_68[uVar7] = (ulong)NVar5.pip.value & 0xffffffffffffffc0;
  }
  local_a8 = 0;
  local_b8 = piVar1;
  if (uVar8 * 8 < uVar14 + 1) {
    uVar7 = uVar8 - 1;
    if (uVar8 == 1) {
      uVar7 = 1;
    }
    uVar18 = (ulong)uVar7;
    local_d8[uVar8] = local_d8[uVar18];
    local_68[uVar8] = local_68[uVar18];
    local_d8[uVar18] = 0;
    pBVar6 = PoolAllocator<char,192ul,64ul>::
             emplace<slang::IntervalMapDetails::BranchNode<unsigned_long,8u,false>>
                       ((PoolAllocator<char,192ul,64ul> *)local_78);
    local_68[uVar18] = (ulong)pBVar6;
    uVar8 = uVar8 + 1;
    local_a8 = uVar18;
  }
  local_b0 = IntervalMapDetails::distribute(uVar8,uVar14,8,local_98,uVar13);
  uVar7 = uVar8 - 1;
  if (uVar7 != 0) {
    local_9c = uVar7;
    uVar18 = (ulong)uVar7;
    iVar10 = uVar8 - 2;
    local_48 = uVar18;
    do {
      uVar7 = local_d8[uVar18];
      uVar12 = local_98[uVar18];
      iVar2 = iVar10;
      if (uVar7 != uVar12) {
        do {
          if (iVar2 == -1) break;
          uVar13 = local_d8[iVar2];
          iVar4 = IntervalMapDetails::
                  NodeBase<slang::IntervalMapDetails::NodeRef,_slang::IntervalMapDetails::interval<unsigned_long>,_8U>
                  ::adjustFromLeftSib((NodeBase<slang::IntervalMapDetails::NodeRef,_slang::IntervalMapDetails::interval<unsigned_long>,_8U>
                                       *)local_68[uVar18],uVar7,
                                      (NodeBase<slang::IntervalMapDetails::NodeRef,_slang::IntervalMapDetails::interval<unsigned_long>,_8U>
                                       *)local_68[iVar2],uVar13,uVar12 - uVar7);
          local_d8[iVar2] = uVar13 - iVar4;
          uVar7 = iVar4 + local_d8[uVar18];
          local_d8[uVar18] = uVar7;
          uVar12 = local_98[uVar18];
          iVar2 = iVar2 + -1;
        } while (uVar7 < uVar12);
      }
      uVar16 = local_48;
      uVar18 = uVar18 - 1;
      iVar10 = iVar10 + -1;
    } while ((int)uVar18 != 0);
    if (local_9c != 0) {
      uVar18 = 1;
      uVar15 = 0;
      do {
        uVar7 = local_d8[uVar15];
        uVar12 = local_98[uVar15];
        uVar19 = uVar18;
        if (uVar7 != uVar12) {
          do {
            if (uVar8 <= uVar19) break;
            uVar13 = local_d8[uVar19];
            iVar10 = IntervalMapDetails::
                     NodeBase<slang::IntervalMapDetails::NodeRef,_slang::IntervalMapDetails::interval<unsigned_long>,_8U>
                     ::adjustFromLeftSib((NodeBase<slang::IntervalMapDetails::NodeRef,_slang::IntervalMapDetails::interval<unsigned_long>,_8U>
                                          *)local_68[uVar19],uVar13,
                                         (NodeBase<slang::IntervalMapDetails::NodeRef,_slang::IntervalMapDetails::interval<unsigned_long>,_8U>
                                          *)local_68[uVar15],uVar7,uVar7 - uVar12);
            local_d8[uVar19] = uVar13 + iVar10;
            uVar7 = local_d8[uVar15] - iVar10;
            local_d8[uVar15] = uVar7;
            uVar12 = local_98[uVar15];
            uVar19 = uVar19 + 1;
          } while (uVar7 < uVar12);
        }
        uVar15 = uVar15 + 1;
        uVar18 = uVar18 + 1;
      } while (uVar15 != uVar16);
    }
  }
  uVar18 = local_80;
  if (local_c0.value != 0) {
    IntervalMapDetails::Path::moveLeft((Path *)local_b8,(uint32_t)local_80);
  }
  uVar19 = local_a8 & 0xffffffff;
  uVar15 = (ulong)local_b0 & 0xffffffff;
  local_c0.value = 0;
  uVar16 = 0;
  while( true ) {
    uVar13 = (uint32_t)uVar18;
    if (uVar16 == uVar19 && (int)local_a8 != 0) {
      uVar18 = local_68[uVar19];
      uVar7 = local_98[uVar19];
      local_40.right = *(ulong *)(uVar18 + 0x48);
      if (1 < (ulong)uVar7) {
        lVar17 = 0;
        do {
          uVar11 = *(ulong *)(uVar18 + 0x58 + lVar17);
          if (local_40.right <= uVar11) {
            local_40.right = uVar11;
          }
          lVar17 = lVar17 + 0x10;
        } while ((ulong)uVar7 * 0x10 + -0x10 != lVar17);
      }
      local_40.left = *(unsigned_long *)(uVar18 + 0x40);
      bVar3 = IntervalMap<unsigned_long,_std::monostate,_0U>::iterator::insertNode
                        ((iterator *)local_70,uVar13,
                         (NodeRef)(uVar18 & 0xffffffffffffffc0 | (ulong)(uVar7 - 1)),&local_40,
                         local_78);
      local_c0.value = CONCAT71(extraout_var,bVar3);
      uVar18 = (ulong)(uVar13 + bVar3);
    }
    else {
      uVar14 = local_98[uVar16];
      lVar17 = *(long *)local_b8;
      *(uint32_t *)(lVar17 + 8 + (uVar18 & 0xffffffff) * 0x10) = uVar14;
      if (uVar13 != 0) {
        lVar9 = (ulong)(uVar13 - 1) * 0x10;
        uVar11 = (ulong)*(uint *)(lVar17 + 0xc + lVar9);
        lVar17 = *(long *)(lVar17 + lVar9);
        *(ulong *)(lVar17 + uVar11 * 8) =
             *(ulong *)(lVar17 + uVar11 * 8) & 0xffffffffffffffc0 | (ulong)(uVar14 - 1);
      }
      IntervalMap<unsigned_long,_std::monostate,_0U>::iterator::recomputeBounds
                ((iterator *)local_70,uVar13);
    }
    piVar1 = local_b8;
    if (uVar16 + 1 == (ulong)uVar8) break;
    IntervalMapDetails::Path::moveRight((Path *)local_b8,(uint32_t)uVar18);
    uVar15 = (ulong)((int)uVar15 - 1);
    uVar16 = uVar16 + 1;
  }
  if ((uint)uVar16 != local_b0.first) {
    do {
      IntervalMapDetails::Path::moveLeft((Path *)piVar1,(uint32_t)uVar18);
      uVar8 = (int)uVar15 + 1;
      uVar15 = (ulong)uVar8;
    } while (uVar8 != 0);
  }
  *(uint *)(*(long *)piVar1 + 0xc + (uVar18 & 0xffffffff) * 0x10) = local_b0.second;
  return (bool)((byte)local_c0.value & 1);
}

Assistant:

bool IntervalMap<TKey, TValue, N>::iterator::overflow(uint32_t level, allocator_type& alloc) {
    SLANG_ASSERT(level > 0);
    using namespace IntervalMapDetails;

    auto& path = this->path;
    uint32_t offset = path.offset(level);
    uint32_t numElems = 0;
    uint32_t numNodes = 0;
    TNode* nodes[4];
    uint32_t curSizes[4];

    // Handle left sibling, if it exists.
    NodeRef leftSib = path.getLeftSibling(level);
    if (leftSib) {
        numElems = curSizes[0] = leftSib.size();
        offset += numElems;
        nodes[numNodes++] = &leftSib.get<TNode>();
    }

    // Handle the current node.
    numElems += curSizes[numNodes] = path.size(level);
    nodes[numNodes++] = &path.template node<TNode>(level);

    // Handle right sibling, if it exists.
    NodeRef rightSib = path.getRightSibling(level);
    if (rightSib) {
        numElems += curSizes[numNodes] = rightSib.size();
        nodes[numNodes++] = &rightSib.get<TNode>();
    }

    // Check if we need to allocate a new node.
    uint32_t newNode = 0;
    if (numElems + 1 > numNodes * TNode::Capacity) {
        // Insert new node at the penultimate position, or after a single node if only one.
        newNode = numNodes == 1 ? 1 : numNodes - 1;
        curSizes[numNodes] = curSizes[newNode];
        nodes[numNodes] = nodes[newNode];
        curSizes[newNode] = 0;
        nodes[newNode] = alloc.template emplace<TNode>();
        numNodes++;
    }

    // Redistribute elements among the nodes.
    uint32_t newSizes[4];
    IndexPair newOffset = distribute(numNodes, numElems, TNode::Capacity, newSizes, offset);

    // Move elements right.
    for (uint32_t n = numNodes - 1; n; --n) {
        if (curSizes[n] == newSizes[n])
            continue;

        for (int m = int(n - 1); m != -1; --m) {
            int delta = nodes[n]->adjustFromLeftSib(curSizes[n], *nodes[m], curSizes[m],
                                                    int(newSizes[n]) - int(curSizes[n]));
            curSizes[m] = uint32_t(int(curSizes[m]) - delta);
            curSizes[n] = uint32_t(int(curSizes[n]) + delta);

            // If the current node was exhausted we can bail out.
            if (curSizes[n] >= newSizes[n])
                break;
        }
    }

    // Move elements left.
    for (uint32_t n = 0; n < numNodes - 1; n++) {
        if (curSizes[n] == newSizes[n])
            continue;

        for (uint32_t m = n + 1; m < numNodes; m++) {
            int delta = nodes[m]->adjustFromLeftSib(curSizes[m], *nodes[n], curSizes[n],
                                                    int(curSizes[n]) - int(newSizes[n]));
            curSizes[m] = uint32_t(int(curSizes[m]) + delta);
            curSizes[n] = uint32_t(int(curSizes[n]) - delta);

            // If the current node was exhausted we can bail out.
            if (curSizes[n] >= newSizes[n])
                break;
        }
    }

    // Move the path to the leftmost node.
    if (leftSib)
        path.moveLeft(level);

    // Elements have been moved, update node sizes and interval bounds.
    bool split = false;
    uint32_t pos = 0;
    while (true) {
        if (newNode && pos == newNode) {
            // Actually insert the new node that we created earlier.
            auto ival = nodes[pos]->getBounds(newSizes[pos]);
            split = insertNode(level, NodeRef(nodes[pos], newSizes[pos]), ival, alloc);
            if (split)
                level++;
        }
        else {
            // Otherwise just update the size and bounds.
            path.setSize(level, newSizes[pos]);
            recomputeBounds(level);
        }

        if (pos + 1 == numNodes)
            break;

        path.moveRight(level);
        ++pos;
    }

    // Move our path to the new offset of the element we used to be pointing at.
    while (pos != newOffset.first) {
        path.moveLeft(level);
        --pos;
    }

    path.offset(level) = newOffset.second;
    return split;
}